

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O1

int BuildHuffmanTable(HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size,
                     uint16_t *sorted)

{
  ushort uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  HuffmanCode HVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  HuffmanCode *pHVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  uint8_t uVar30;
  int iVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int offset [16];
  int local_fc;
  long local_d0;
  int iStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  int aiStack_78 [18];
  
  bVar10 = (byte)root_bits;
  iVar7 = 1 << (bVar10 & 0x1f);
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  if (0 < code_lengths_size) {
    uVar13 = 0;
    do {
      if (0xf < (long)code_lengths[uVar13]) {
        return 0;
      }
      *(int *)(local_b8 + (long)code_lengths[uVar13] * 4) =
           *(int *)(local_b8 + (long)code_lengths[uVar13] * 4) + 1;
      uVar13 = uVar13 + 1;
    } while ((uint)code_lengths_size != uVar13);
  }
  if (local_b8._0_4_ == code_lengths_size) {
LAB_0012e663:
    iVar7 = 0;
  }
  else {
    aiStack_78[1] = 0;
    lVar28 = 0;
    do {
      if (1 << ((char)lVar28 + 1U & 0x1f) < *(int *)(local_b8 + lVar28 * 4 + 4)) {
        return 0;
      }
      aiStack_78[lVar28 + 2] = *(int *)(local_b8 + lVar28 * 4 + 4) + aiStack_78[lVar28 + 1];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0xe);
    if (0 < code_lengths_size) {
      uVar13 = 0;
      do {
        lVar28 = (long)code_lengths[uVar13];
        if (0 < lVar28) {
          iVar26 = aiStack_78[lVar28];
          if (sorted == (uint16_t *)0x0) {
            aiStack_78[lVar28] = iVar26 + 1;
          }
          else {
            if (code_lengths_size <= iVar26) goto LAB_0012e663;
            aiStack_78[lVar28] = iVar26 + 1;
            sorted[iVar26] = (uint16_t)uVar13;
          }
        }
        uVar13 = uVar13 + 1;
      } while ((uint)code_lengths_size != uVar13);
    }
    auVar5 = _DAT_001b8ce0;
    auVar4 = _DAT_001b7770;
    auVar3 = _DAT_001b6540;
    if (aiStack_78[0xf] == 1) {
      if (sorted != (uint16_t *)0x0) {
        HVar8 = (HuffmanCode)((uint)*sorted << 0x10);
        lVar17 = (long)iVar7;
        lVar28 = 1;
        if (1 < lVar17) {
          lVar28 = lVar17;
        }
        lVar24 = lVar28 + -1;
        auVar33._8_4_ = (int)lVar24;
        auVar33._0_8_ = lVar24;
        auVar33._12_4_ = (int)((ulong)lVar24 >> 0x20);
        pHVar18 = root_table + lVar17 + -1;
        uVar13 = 0;
        auVar33 = auVar33 ^ _DAT_001b7770;
        do {
          auVar34._8_4_ = (int)uVar13;
          auVar34._0_8_ = uVar13;
          auVar34._12_4_ = (int)(uVar13 >> 0x20);
          auVar35 = (auVar34 | auVar3) ^ auVar4;
          iVar26 = auVar33._4_4_;
          if ((bool)(~(auVar35._4_4_ == iVar26 && auVar33._0_4_ < auVar35._0_4_ ||
                      iVar26 < auVar35._4_4_) & 1)) {
            *pHVar18 = HVar8;
          }
          if ((auVar35._12_4_ != auVar33._12_4_ || auVar35._8_4_ <= auVar33._8_4_) &&
              auVar35._12_4_ <= auVar33._12_4_) {
            pHVar18[-1] = HVar8;
          }
          auVar34 = (auVar34 | auVar5) ^ auVar4;
          iVar15 = auVar34._4_4_;
          if (iVar15 <= iVar26 && (iVar15 != iVar26 || auVar34._0_4_ <= auVar33._0_4_)) {
            pHVar18[-2] = HVar8;
            pHVar18[-3] = HVar8;
          }
          uVar13 = uVar13 + 4;
          pHVar18 = pHVar18 + -4;
        } while (((int)lVar28 + 3U & 0xfffffffc) != uVar13);
      }
    }
    else {
      if (root_bits < 1) {
        iVar15 = 1;
        uVar13 = 0;
        iVar26 = 1;
        uVar29 = 0;
      }
      else {
        iVar12 = 2;
        uVar25 = 1;
        uVar29 = 0;
        iVar15 = 1;
        uVar13 = 0;
        iVar9 = 1;
        do {
          iVar26 = iVar9 * 2 - *(int *)(local_b8 + uVar25 * 4);
          if (iVar26 < 0) goto LAB_0012e663;
          if (root_table != (HuffmanCode *)0x0) {
            iVar31 = *(int *)(local_b8 + uVar25 * 4);
            if (0 < iVar31) {
              uVar29 = (ulong)(int)uVar29;
              do {
                uVar1 = sorted[uVar29];
                iVar27 = iVar7;
                do {
                  iVar19 = iVar27 - iVar12;
                  iVar27 = iVar27 - iVar12;
                  root_table[uVar13 + (long)iVar19] =
                       (HuffmanCode)((uint)uVar1 << 0x10 | (uint)uVar25 & 0xff);
                  uVar32 = 1 << ((char)uVar25 - 1U & 0x1f);
                } while (0 < iVar27);
                do {
                  uVar22 = uVar32;
                  uVar32 = uVar22 >> 1;
                } while ((uVar22 & (uint)uVar13) != 0);
                uVar29 = uVar29 + 1;
                uVar13 = (ulong)(((uint)uVar13 & uVar22 - 1) + uVar22);
                bVar2 = 1 < iVar31;
                iVar31 = iVar31 + -1;
              } while (bVar2);
              iVar31 = 0;
            }
            *(int *)(local_b8 + uVar25 * 4) = iVar31;
          }
          iVar15 = iVar15 + iVar9 * 2;
          uVar25 = uVar25 + 1;
          iVar12 = iVar12 * 2;
          iVar9 = iVar26;
        } while (uVar25 != root_bits + 1);
      }
      iVar12 = iVar7;
      if (root_bits < 0xf) {
        uVar22 = iVar7 - 1;
        local_fc = root_bits + 1;
        local_d0 = (long)root_bits + 2;
        uVar32 = 0xffffffff;
        iVar9 = 2;
        lVar28 = (long)root_bits;
        pHVar18 = root_table;
        do {
          iVar31 = iVar26 * 2 - *(int *)(local_b8 + lVar28 * 4 + 4);
          if (iVar31 < 0) goto LAB_0012e663;
          lVar17 = lVar28 + 1;
          if (*(int *)(local_b8 + lVar17 * 4) < 1) {
            uVar23 = (uint)uVar13;
          }
          else {
            uVar16 = (int)lVar17 - root_bits;
            uVar20 = 1 << ((byte)lVar28 & 0x1f);
            do {
              uVar21 = (uint)uVar13;
              uVar23 = uVar21 & uVar22;
              if (uVar23 != uVar32) {
                lVar24 = (long)iVar7;
                if (root_table == (HuffmanCode *)0x0) {
                  lVar24 = 0;
                }
                uVar30 = (uint8_t)lVar17;
                lVar14 = local_d0;
                iVar27 = 1 << ((byte)uVar16 & 0x1f);
                iVar7 = local_fc;
                if (lVar28 != 0xe) {
                  do {
                    uVar30 = (uint8_t)iVar7;
                    iVar19 = iVar27 - (&iStack_bc)[lVar14];
                    if (iVar19 == 0 || iVar27 < (&iStack_bc)[lVar14]) goto LAB_0012ea14;
                    iVar11 = (int)lVar14;
                    lVar14 = lVar14 + 1;
                    iVar27 = iVar19 * 2;
                    iVar7 = iVar7 + 1;
                  } while (iVar11 != 0xf);
                  uVar30 = '\x0f';
                }
LAB_0012ea14:
                iVar7 = 1 << (uVar30 - bVar10 & 0x1f);
                pHVar18 = pHVar18 + lVar24;
                iVar12 = iVar12 + iVar7;
                uVar32 = uVar23;
                if (root_table != (HuffmanCode *)0x0) {
                  root_table[uVar23].bits = uVar30;
                  root_table[uVar23].value =
                       (short)((uint)((int)pHVar18 - (int)root_table) >> 2) - (short)uVar23;
                }
              }
              uVar6 = uVar20;
              if (root_table != (HuffmanCode *)0x0) {
                uVar1 = sorted[(int)uVar29];
                iVar27 = iVar7;
                do {
                  iVar19 = iVar27 - iVar9;
                  iVar27 = iVar27 - iVar9;
                  pHVar18[(ulong)(uVar21 >> (bVar10 & 0x1f)) + (long)iVar19] =
                       (HuffmanCode)((uint)uVar1 * 0x10000 + (uVar16 & 0xff));
                } while (0 < iVar27);
                uVar29 = (ulong)((int)uVar29 + 1);
              }
              do {
                uVar23 = uVar6;
                uVar6 = uVar23 >> 1;
              } while ((uVar23 & uVar21) != 0);
              uVar23 = (uVar23 - 1 & uVar21) + uVar23;
              iVar27 = *(int *)(local_b8 + lVar17 * 4);
              *(int *)(local_b8 + lVar17 * 4) = iVar27 + -1;
              uVar13 = (ulong)uVar23;
            } while (1 < iVar27);
          }
          iVar15 = iVar15 + iVar26 * 2;
          iVar9 = iVar9 * 2;
          local_fc = local_fc + 1;
          local_d0 = local_d0 + 1;
          uVar13 = (ulong)uVar23;
          lVar28 = lVar17;
          iVar26 = iVar31;
        } while (lVar17 != 0xf);
      }
      iVar7 = 0;
      if (iVar15 == aiStack_78[0xf] * 2 + -1) {
        iVar7 = iVar12;
      }
    }
  }
  return iVar7;
}

Assistant:

static int BuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                             const int code_lengths[], int code_lengths_size,
                             uint16_t sorted[]) {
  HuffmanCode* table = root_table;  // next available space in table
  int total_size = 1 << root_bits;  // total size root table + 2nd level table
  int len;                          // current code length
  int symbol;                       // symbol index in original or sorted table
  // number of codes of each length:
  int count[MAX_ALLOWED_CODE_LENGTH + 1] = { 0 };
  // offsets in sorted table for each length:
  int offset[MAX_ALLOWED_CODE_LENGTH + 1];

  assert(code_lengths_size != 0);
  assert(code_lengths != NULL);
  assert((root_table != NULL && sorted != NULL) ||
         (root_table == NULL && sorted == NULL));
  assert(root_bits > 0);

  // Build histogram of code lengths.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    if (code_lengths[symbol] > MAX_ALLOWED_CODE_LENGTH) {
      return 0;
    }
    ++count[code_lengths[symbol]];
  }

  // Error, all code lengths are zeros.
  if (count[0] == code_lengths_size) {
    return 0;
  }

  // Generate offsets into sorted symbol table by code length.
  offset[1] = 0;
  for (len = 1; len < MAX_ALLOWED_CODE_LENGTH; ++len) {
    if (count[len] > (1 << len)) {
      return 0;
    }
    offset[len + 1] = offset[len] + count[len];
  }

  // Sort symbols by length, by symbol order within each length.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    const int symbol_code_length = code_lengths[symbol];
    if (code_lengths[symbol] > 0) {
      if (sorted != NULL) {
        if(offset[symbol_code_length] >= code_lengths_size) {
            return 0;
        }
        sorted[offset[symbol_code_length]++] = symbol;
      } else {
        offset[symbol_code_length]++;
      }
    }
  }

  // Special case code with only one value.
  if (offset[MAX_ALLOWED_CODE_LENGTH] == 1) {
    if (sorted != NULL) {
      HuffmanCode code;
      code.bits = 0;
      code.value = (uint16_t)sorted[0];
      ReplicateValue(table, 1, total_size, code);
    }
    return total_size;
  }

  {
    int step;              // step size to replicate values in current table
    uint32_t low = 0xffffffffu;        // low bits for current root entry
    uint32_t mask = total_size - 1;    // mask for low bits
    uint32_t key = 0;      // reversed prefix code
    int num_nodes = 1;     // number of Huffman tree nodes
    int num_open = 1;      // number of open branches in current tree level
    int table_bits = root_bits;        // key length of current table
    int table_size = 1 << table_bits;  // size of current table
    symbol = 0;
    // Fill in root table.
    for (len = 1, step = 2; len <= root_bits; ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        code.bits = (uint8_t)len;
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Fill in 2nd level tables and add pointers to root table.
    for (len = root_bits + 1, step = 2; len <= MAX_ALLOWED_CODE_LENGTH;
         ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        if ((key & mask) != low) {
          if (root_table != NULL) table += table_size;
          table_bits = NextTableBitSize(count, len, root_bits);
          table_size = 1 << table_bits;
          total_size += table_size;
          low = key & mask;
          if (root_table != NULL) {
            root_table[low].bits = (uint8_t)(table_bits + root_bits);
            root_table[low].value = (uint16_t)((table - root_table) - low);
          }
        }
        if (root_table != NULL) {
          code.bits = (uint8_t)(len - root_bits);
          code.value = (uint16_t)sorted[symbol++];
          ReplicateValue(&table[key >> root_bits], step, table_size, code);
        }
        key = GetNextKey(key, len);
      }
    }

    // Check if tree is full.
    if (num_nodes != 2 * offset[MAX_ALLOWED_CODE_LENGTH] - 1) {
      return 0;
    }
  }

  return total_size;
}